

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O1

real __thiscall fasttext::Matrix::dotRow(Matrix *this,Vector *vec,int64_t i)

{
  pointer pfVar1;
  long lVar2;
  runtime_error *this_00;
  long lVar3;
  float fVar4;
  undefined1 auVar5 [16];
  
  if (i < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/matrix.cc"
                  ,0x25,"real fasttext::Matrix::dotRow(const Vector &, int64_t) const");
  }
  if (this->m_ <= i) {
    __assert_fail("i < m_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/matrix.cc"
                  ,0x26,"real fasttext::Matrix::dotRow(const Vector &, int64_t) const");
  }
  pfVar1 = (vec->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = this->n_;
  if ((long)(vec->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pfVar1 >> 2 != lVar2) {
    __assert_fail("vec.size() == n_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/matrix.cc"
                  ,0x27,"real fasttext::Matrix::dotRow(const Vector &, int64_t) const");
  }
  if (lVar2 < 1) {
    fVar4 = 0.0;
  }
  else {
    auVar5 = ZEXT816(0);
    lVar3 = 0;
    do {
      auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)(this->data_).
                                                                                                        
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start
                                                  [i * lVar2 + lVar3]),ZEXT416((uint)pfVar1[lVar3]))
      ;
      fVar4 = auVar5._0_4_;
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  if (NAN(fVar4)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Encountered NaN.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return fVar4;
}

Assistant:

real Matrix::dotRow(const Vector& vec, int64_t i) const {
  assert(i >= 0);
  assert(i < m_);
  assert(vec.size() == n_);
  real d = 0.0;
  for (int64_t j = 0; j < n_; j++) {
    d += at(i, j) * vec[j];
  }
  if (std::isnan(d)) {
    throw std::runtime_error("Encountered NaN.");
  }
  return d;
}